

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::FCDUTF16CollationIterator::handleNextCE32
          (FCDUTF16CollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UChar **ppUVar2;
  char cVar3;
  UChar UVar4;
  UChar *pUVar5;
  UTrie2 *pUVar6;
  UBool UVar7;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  UChar *pUVar11;
  
  cVar3 = this->checkDir;
  while (cVar3 < '\x01') {
    if ((cVar3 == '\0') &&
       (pUVar11 = (this->super_UTF16CollationIterator).pos,
       pUVar11 != (this->super_UTF16CollationIterator).limit)) goto LAB_002315bb;
    switchToForward(this);
    cVar3 = this->checkDir;
  }
  pUVar11 = (this->super_UTF16CollationIterator).pos;
  pUVar5 = (this->super_UTF16CollationIterator).limit;
  if (pUVar11 == pUVar5) {
LAB_002315e8:
    *c = -1;
    uVar10 = 0xc0;
  }
  else {
    ppUVar2 = &(this->super_UTF16CollationIterator).pos;
    pUVar1 = pUVar11 + 1;
    *ppUVar2 = pUVar1;
    UVar4 = *pUVar11;
    uVar8 = (uint)(ushort)UVar4;
    *c = (uint)(ushort)UVar4;
    uVar9 = (uint)(ushort)UVar4;
    if (0xbf < (ushort)UVar4) {
      uVar9 = uVar8;
      if ((((ulong)(byte)CollationFCD::tcccIndex[(ushort)UVar4 >> 5] != 0) &&
          ((*(uint *)(CollationFCD::tcccBits +
                     (ulong)(byte)CollationFCD::tcccIndex[(ushort)UVar4 >> 5] * 4) >>
            ((ushort)UVar4 & 0x1f) & 1) != 0)) &&
         ((((ushort)UVar4 & 0xff01) == 0xf01 ||
          ((((pUVar1 != pUVar5 && (UVar4 = *pUVar1, 0x2ff < (ushort)UVar4)) &&
            ((ulong)(byte)CollationFCD::lcccIndex[(ushort)UVar4 >> 5] != 0)) &&
           ((*(uint *)(CollationFCD::lcccBits +
                      (ulong)(byte)CollationFCD::lcccIndex[(ushort)UVar4 >> 5] * 4) >>
             ((ushort)UVar4 & 0x1f) & 1) != 0)))))) {
        (this->super_UTF16CollationIterator).pos = pUVar11;
        UVar7 = nextSegment(this,errorCode);
        if (UVar7 == '\0') goto LAB_002315e8;
        pUVar11 = *ppUVar2;
LAB_002315bb:
        (this->super_UTF16CollationIterator).pos = pUVar11 + 1;
        UVar4 = *pUVar11;
        *c = (uint)(ushort)UVar4;
        uVar9 = (uint)(ushort)UVar4;
      }
    }
    pUVar6 = (this->super_UTF16CollationIterator).super_CollationIterator.trie;
    uVar10 = pUVar6->data32[(uVar9 & 0x1f) + (uint)pUVar6->index[uVar9 >> 5] * 4];
  }
  return uVar10;
}

Assistant:

uint32_t
FCDUTF16CollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(checkDir > 0) {
            if(pos == limit) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            c = *pos++;
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != limit && CollationFCD::hasLccc(*pos))) {
                    --pos;
                    if(!nextSegment(errorCode)) {
                        c = U_SENTINEL;
                        return Collation::FALLBACK_CE32;
                    }
                    c = *pos++;
                }
            }
            break;
        } else if(checkDir == 0 && pos != limit) {
            c = *pos++;
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}